

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3537c6::ParameterPack::printRight(ParameterPack *this,OutputStream *S)

{
  ulong uVar1;
  ulong uVar2;
  
  if (S->CurrentPackMax == 0xffffffff) {
    uVar2 = (this->Data).NumElements;
    S->CurrentPackMax = (uint)uVar2;
    S->CurrentPackIndex = 0;
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)S->CurrentPackIndex;
    uVar2 = (this->Data).NumElements;
  }
  if (uVar1 < uVar2) {
    (*(this->Data).Elements[uVar1]->_vptr_Node[5])();
    return;
  }
  return;
}

Assistant:

void initializePackExpansion(OutputStream &S) const {
    if (S.CurrentPackMax == std::numeric_limits<unsigned>::max()) {
      S.CurrentPackMax = static_cast<unsigned>(Data.size());
      S.CurrentPackIndex = 0;
    }
  }